

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pound.c
# Opt level: O3

void read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_stream_t *req;
  
  if (-1 < nread) {
    return;
  }
  if (nread == -0xfff) {
    req = stream + 1;
    iVar1 = uv_shutdown((uv_shutdown_t *)req,stream,shutdown_cb);
    stream = req;
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    read_cb_cold_1();
  }
  read_cb_cold_2();
  uv_close((uv_handle_t *)(stream + -1),close_cb);
  return;
}

Assistant:

static void read_cb(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {

  ASSERT_NOT_NULL(stream);

#if DEBUG
  printf("read_cb %d\n", p->i);
#endif

  uv_close((uv_handle_t*)stream, close_cb);

  if (nread < 0) {
    if (nread == UV_EOF) {
      ;
    } else if (nread == UV_ECONNRESET) {
      conns_failed++;
    } else {
      fprintf(stderr, "read error %s\n", uv_err_name(nread));
      ASSERT(0);
    }
  }
}